

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfKeyValue.c
# Opt level: O0

char * sbfKeyValue_first(sbfKeyValue table,void **cookie)

{
  sbfKeyValueItemImpl *psVar1;
  undefined8 *in_RSI;
  sbfKeyValueItemTreeImpl *in_RDI;
  sbfKeyValueItem item;
  char *local_8;
  
  psVar1 = sbfKeyValueItemTreeImpl_RB_MINMAX(in_RDI,-1);
  if (psVar1 == (sbfKeyValueItemImpl *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    *in_RSI = psVar1;
    local_8 = psVar1->mKey;
  }
  return local_8;
}

Assistant:

const char*
sbfKeyValue_first (sbfKeyValue table, void** cookie)
{
    sbfKeyValueItem item;

    item = RB_MIN (sbfKeyValueItemTreeImpl, &table->mTree);
    if (item == NULL)
        return NULL;

    *cookie = item;
    return item->mKey;
}